

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O0

void __thiscall bgui::BaseWindow::sendClose(BaseWindow *this)

{
  long in_RDI;
  XEvent event;
  undefined4 local_c8 [6];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0xd0) & 1) != 0) {
    pthread_mutex_lock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + 0xa0));
    if (*(long *)(*(long *)(in_RDI + 8) + 8) != 0) {
      memset(local_c8,0,0xc0);
      local_c8[0] = 0x21;
      local_b0 = *(undefined8 *)(*(long *)(in_RDI + 8) + 8);
      local_a8 = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x18);
      local_a0 = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x28);
      local_98 = 0x20;
      local_90 = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x28);
      XSendEvent(*(undefined8 *)(*(long *)(in_RDI + 8) + 8),
                 *(undefined8 *)(*(long *)(in_RDI + 8) + 0x18),0,0,local_c8);
      XFlush(*(undefined8 *)(*(long *)(in_RDI + 8) + 8));
    }
    pthread_mutex_unlock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + 0xa0));
  }
  return;
}

Assistant:

void BaseWindow::sendClose()
{
  XEvent event;

  if (p->running)
  {
    pthread_mutex_lock(&(p->mutex));

    // request to close the window

    if (p->display != NULL)
    {
      memset(&event, 0, sizeof(XEvent));
      event.type=ClientMessage;
      event.xclient.display=p->display;
      event.xclient.window=p->window;
      event.xclient.message_type=p->wm_delete_window;
      event.xclient.format=32;
      event.xclient.data.l[0]=p->wm_delete_window;

      XSendEvent(p->display, p->window, False, 0, &event);
      XFlush(p->display);
    }

    pthread_mutex_unlock(&(p->mutex));
  }
}